

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O1

void Abc_ObjPrintNeighborhood_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vNodes,int depth)

{
  uint uVar1;
  void **ppvVar2;
  int iVar3;
  long lVar4;
  
  if (depth < 0 || (char)((*(uint *)&pObj->field_0x14 & 0x40) >> 6) != '\0') {
    return;
  }
  *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 | 0x40;
  uVar1 = vNodes->nCap;
  if (vNodes->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(0x80);
      }
      else {
        ppvVar2 = (void **)realloc(vNodes->pArray,0x80);
      }
      vNodes->pArray = ppvVar2;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar1 * 2;
      if (iVar3 <= (int)uVar1) goto LAB_00476353;
      if (vNodes->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar2 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
      }
      vNodes->pArray = ppvVar2;
    }
    vNodes->nCap = iVar3;
  }
LAB_00476353:
  iVar3 = vNodes->nSize;
  vNodes->nSize = iVar3 + 1;
  vNodes->pArray[iVar3] = pObj;
  Abc_ObjPrint(_stdout,pObj);
  if (0 < (pObj->vFanouts).nSize) {
    lVar4 = 0;
    do {
      Abc_ObjPrintNeighborhood_rec
                ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar4]],vNodes,
                 depth + -1);
      lVar4 = lVar4 + 1;
    } while (lVar4 < (pObj->vFanouts).nSize);
  }
  if (0 < (pObj->vFanins).nSize) {
    lVar4 = 0;
    do {
      Abc_ObjPrintNeighborhood_rec
                ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar4]],vNodes,
                 depth + -1);
      lVar4 = lVar4 + 1;
    } while (lVar4 < (pObj->vFanins).nSize);
  }
  return;
}

Assistant:

static void Abc_ObjPrintNeighborhood_rec( Abc_Obj_t *pObj, Vec_Ptr_t *vNodes, int depth ) {
  Abc_Obj_t *pObj2;
  int i;
  
  if (pObj->fMarkC || depth < 0) return;

  pObj->fMarkC = 1;
  Vec_PtrPush( vNodes, pObj );

  Abc_ObjPrint( stdout, pObj );

  Abc_ObjForEachFanout(pObj, pObj2, i) {
    Abc_ObjPrintNeighborhood_rec( pObj2, vNodes, depth-1 );
  }
  Abc_ObjForEachFanin(pObj, pObj2, i) {
    Abc_ObjPrintNeighborhood_rec( pObj2, vNodes, depth-1 );
  }
}